

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O1

int Abc_NtkDarCec(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int nConfLimit,int fPartition,int fVerbose)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *pMan1;
  Aig_Man_t *pMan2;
  Abc_Ntk_t *pMiter;
  int *piVar3;
  long lVar4;
  long lVar5;
  char *format;
  int level;
  Abc_Ntk_t *pAVar6;
  timespec ts;
  Aig_Man_t *pMan;
  timespec local_48;
  Aig_Man_t *local_38;
  
  iVar2 = 3;
  iVar1 = clock_gettime(3,&local_48);
  if (iVar1 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  if (fPartition == 1 && pNtk2 == (Abc_Ntk_t *)0x0) {
    fPartition = 0;
    Abc_Print(iVar2,"Abc_NtkDarCec(): Switching to non-partitioned CEC for the miter.\n");
  }
  if (fPartition == 0) {
    if (pNtk2 == (Abc_Ntk_t *)0x0) {
      pMiter = Abc_NtkDup(pNtk1);
    }
    else {
      pAVar6 = pNtk1;
      pMiter = Abc_NtkMiter(pNtk1,pNtk2,0,0,0,0);
      if (pMiter == (Abc_Ntk_t *)0x0) {
        Abc_Print((int)pAVar6,"Miter computation has failed.\n");
        return 0;
      }
    }
    pAVar6 = pMiter;
    iVar1 = Abc_NtkMiterIsConstant(pMiter);
    if (iVar1 == 1) {
      Abc_NtkDelete(pMiter);
      Abc_Print((int)pMiter,"Networks are equivalent after structural hashing.\n");
      return 1;
    }
    if (iVar1 == 0) {
      Abc_Print((int)pAVar6,"Networks are NOT EQUIVALENT after structural hashing.\n");
      if (pNtk2 == (Abc_Ntk_t *)0x0) {
        piVar3 = Abc_NtkVerifyGetCleanModel(pNtk1,1);
        pNtk1->pModel = piVar3;
      }
      Abc_NtkDelete(pMiter);
      return 0;
    }
    local_38 = Abc_NtkToDar(pMiter,0,0);
    Abc_NtkDelete(pMiter);
    if (local_38 == (Aig_Man_t *)0x0) {
      Abc_Print((int)pMiter,"Converting miter into AIG has failed.\n");
      return -1;
    }
    iVar1 = Fra_FraigCec(&local_38,100000,fVerbose);
    pMan2 = local_38;
    if (pNtk2 == (Abc_Ntk_t *)0x0) {
      pNtk1->pModel = (int *)local_38->pData;
      local_38->pData = (void *)0x0;
    }
  }
  else {
    pMan1 = Abc_NtkToDar(pNtk1,0,0);
    pMan2 = Abc_NtkToDar(pNtk2,0,0);
    iVar1 = Fra_FraigCecPartitioned(pMan1,pMan2,nConfLimit,100,1,fVerbose);
    Aig_ManStop(pMan1);
  }
  Aig_ManStop(pMan2);
  iVar2 = (int)pMan2;
  if (iVar1 == 0) {
    format = "Networks are NOT EQUIVALENT.  ";
  }
  else if (iVar1 == 1) {
    format = "Networks are equivalent.  ";
  }
  else {
    format = "Networks are UNDECIDED.  ";
  }
  Abc_Print(iVar2,format);
  Abc_Print(iVar2,"%s =","Time");
  level = 3;
  iVar2 = clock_gettime(3,&local_48);
  if (iVar2 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  Abc_Print(level,"%9.2f sec\n",(double)(lVar4 + lVar5) / 1000000.0);
  fflush(_stdout);
  return iVar1;
}

Assistant:

int Abc_NtkDarCec( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nConfLimit, int fPartition, int fVerbose )
{
    Aig_Man_t * pMan, * pMan1, * pMan2;
    Abc_Ntk_t * pMiter;
    int RetValue;
    abctime clkTotal = Abc_Clock();
/*
    {
    extern void Cec_ManVerifyTwoAigs( Aig_Man_t * pAig0, Aig_Man_t * pAig1, int fVerbose );
    Aig_Man_t * pAig0 = Abc_NtkToDar( pNtk1, 0, 0 );
    Aig_Man_t * pAig1 = Abc_NtkToDar( pNtk2, 0, 0 );
    Cec_ManVerifyTwoAigs( pAig0, pAig1, 1 );
    Aig_ManStop( pAig0 );
    Aig_ManStop( pAig1 );
    return 1;
    }
*/
    // cannot partition if it is already a miter
    if ( pNtk2 == NULL && fPartition == 1 )
    {
        Abc_Print( 1, "Abc_NtkDarCec(): Switching to non-partitioned CEC for the miter.\n" );
        fPartition = 0;
    }

    // if partitioning is selected, call partitioned CEC
    if ( fPartition )
    {
        pMan1 = Abc_NtkToDar( pNtk1, 0, 0 );
        pMan2 = Abc_NtkToDar( pNtk2, 0, 0 );
        RetValue = Fra_FraigCecPartitioned( pMan1, pMan2, nConfLimit, 100, 1, fVerbose );
        Aig_ManStop( pMan1 );
        Aig_ManStop( pMan2 );
        goto finish;
    }

    if ( pNtk2 != NULL )
    {
        // get the miter of the two networks
        pMiter = Abc_NtkMiter( pNtk1, pNtk2, 0, 0, 0, 0 );
        if ( pMiter == NULL )
        {
            Abc_Print( 1, "Miter computation has failed.\n" );
            return 0;
        }
    }
    else
    {
        pMiter = Abc_NtkDup( pNtk1 );
    }
    RetValue = Abc_NtkMiterIsConstant( pMiter );
    if ( RetValue == 0 )
    {
//        extern void Abc_NtkVerifyReportErrorSeq( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int * pModel, int nFrames );
        Abc_Print( 1, "Networks are NOT EQUIVALENT after structural hashing.\n" );
        // report the error
        if ( pNtk2 == NULL )
            pNtk1->pModel = Abc_NtkVerifyGetCleanModel( pNtk1, 1 );
//        pMiter->pModel = Abc_NtkVerifyGetCleanModel( pMiter, nFrames );
//        Abc_NtkVerifyReportErrorSeq( pNtk1, pNtk2, pMiter->pModel, nFrames );
//        ABC_FREE( pMiter->pModel );
        Abc_NtkDelete( pMiter );
        return 0;
    }
    if ( RetValue == 1 )
    {
        Abc_NtkDelete( pMiter );
        Abc_Print( 1, "Networks are equivalent after structural hashing.\n" );
        return 1;
    }

    // derive the AIG manager
    pMan = Abc_NtkToDar( pMiter, 0, 0 );
    Abc_NtkDelete( pMiter );
    if ( pMan == NULL )
    {
        Abc_Print( 1, "Converting miter into AIG has failed.\n" );
        return -1;
    }
    // perform verification
    RetValue = Fra_FraigCec( &pMan, 100000, fVerbose );
    // transfer model if given
    if ( pNtk2 == NULL )
        pNtk1->pModel = (int *)pMan->pData, pMan->pData = NULL;
    Aig_ManStop( pMan );

finish:
    // report the miter
    if ( RetValue == 1 )
    {
        Abc_Print( 1, "Networks are equivalent.  " );
ABC_PRT( "Time", Abc_Clock() - clkTotal );
    }
    else if ( RetValue == 0 )
    {
        Abc_Print( 1, "Networks are NOT EQUIVALENT.  " );
ABC_PRT( "Time", Abc_Clock() - clkTotal );
    }
    else
    {
        Abc_Print( 1, "Networks are UNDECIDED.  " );
ABC_PRT( "Time", Abc_Clock() - clkTotal );
    }
    fflush( stdout );
    return RetValue;
}